

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DebugDirCVEntryWrapper::getSignature(QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  QString local_58;
  QString local_40;
  undefined1 local_21;
  long local_20;
  DEBUG_RSDSI *rdsi;
  DebugDirCVEntryWrapper *this_local;
  QString *out;
  
  rdsi = (DEBUG_RSDSI *)this;
  this_local = (DebugDirCVEntryWrapper *)__return_storage_ptr__;
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  local_20 = CONCAT44(extraout_var,iVar1);
  if (local_20 == 0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    local_21 = 0;
    QString::QString(__return_storage_ptr__);
    QString::QString(&local_58);
    QString::asprintf((char *)&local_40,"%.4s",local_20);
    QString::operator=(__return_storage_ptr__,&local_40);
    QString::~QString(&local_40);
    QString::~QString(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getSignature()
{
    DEBUG_RSDSI* rdsi = (DEBUG_RSDSI*)this->getPtr();
    if (!rdsi) return "";

    QString out;
#if QT_VERSION >= 0x050000
    out = QString().asprintf("%.4s", (char*)&rdsi->dwSig);
#else
    out = QString().sprintf("%.4s", (char*)&rdsi->dwSig);
#endif
    return out;
}